

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void bifinpdlg(bifcxdef *ctx,int argc)

{
  uchar uVar1;
  byte bVar2;
  byte *pbVar3;
  int iVar4;
  size_t sVar5;
  runcxdef *prVar6;
  runsdef *prVar7;
  byte *pbVar8;
  int default_index;
  long lVar9;
  int cancel_index;
  long lVar10;
  ulong uVar11;
  uint len;
  char *labels [10];
  char lblbuf [256];
  char prompt [256];
  uint local_29c;
  ushort *local_298;
  long local_290;
  char *local_288 [10];
  byte local_238 [256];
  byte local_138 [264];
  
  prVar7 = ctx->bifcxrun->runcxsp;
  ctx->bifcxrun->runcxsp = prVar7 + -1;
  prVar6 = ctx->bifcxrun;
  if (prVar7[-1].runstyp == '\x01') {
    prVar7 = prVar6->runcxsp;
    lVar9 = (prVar7->runsv).runsvnum;
    prVar6->runcxsp = prVar7 + -1;
    if (prVar7[-1].runstyp != '\x03') {
      ctx->bifcxrun->runcxerr->errcxptr->erraac = 0;
      runsign(ctx->bifcxrun,0x3ef);
    }
    local_298 = (ushort *)(ctx->bifcxrun->runcxsp->runsv).runsvstr;
    bifcstr(ctx,(char *)local_138,0x100,(uchar *)local_298);
    if (local_138[0] != 0) {
      pbVar8 = local_138;
      do {
        pbVar8 = pbVar8 + 1;
        pbVar8[-1] = G_cmap_output[local_138[0]];
        local_138[0] = *pbVar8;
      } while (local_138[0] != 0);
    }
    prVar7 = ctx->bifcxrun->runcxsp;
    uVar1 = prVar7[-1].runstyp;
    ctx->bifcxrun->runcxsp = prVar7 + -1;
    prVar6 = ctx->bifcxrun;
    if (uVar1 == '\x01') {
      if (prVar7[-1].runstyp != '\x01') goto LAB_00210299;
      prVar7 = prVar6->runcxsp;
      iVar4 = *(int *)&prVar7->runsv;
      uVar11 = 0;
    }
    else {
      if (prVar7[-1].runstyp != '\a') {
        prVar6->runcxerr->errcxptr->erraac = 0;
        runsign(ctx->bifcxrun,0x3fc);
      }
      prVar7 = prVar6->runcxsp;
      local_298 = (ushort *)((long)(prVar7->runsv).runsvstr + 2);
      local_29c = (uint)*(ushort *)(prVar7->runsv).runsvstr;
      if (local_29c == 0) {
        uVar11 = 0;
        iVar4 = 0;
      }
      else {
        pbVar8 = local_238;
        lVar10 = 0;
        uVar11 = 0;
        local_290 = lVar9;
        do {
          if ((char)*local_298 == '\x01') {
            if ((*(int *)((long)local_298 + 1) - 1U < 4) &&
               (iVar4 = os_get_str_rsc(*(int *)((long)local_298 + 1),(char *)pbVar8,0x100 - lVar10),
               iVar4 == 0)) goto LAB_002101aa;
          }
          else if ((char)*local_298 == '\x03') {
            bifcstr(ctx,(char *)pbVar8,0x100 - lVar10,(uchar *)((long)local_298 + 1));
            bVar2 = local_238[lVar10];
            pbVar3 = pbVar8;
            while (bVar2 != 0) {
              *pbVar3 = G_cmap_output[bVar2];
              bVar2 = pbVar3[1];
              pbVar3 = pbVar3 + 1;
            }
LAB_002101aa:
            local_288[uVar11] = (char *)pbVar8;
            uVar11 = uVar11 + 1;
            sVar5 = strlen((char *)pbVar8);
            lVar10 = lVar10 + sVar5 + 1;
          }
          if ((9 < uVar11) || (0xff < lVar10)) break;
          lstadv((uchar **)&local_298,&local_29c);
          pbVar8 = local_238 + lVar10;
        } while (local_29c != 0);
        prVar6 = ctx->bifcxrun;
        prVar7 = prVar6->runcxsp;
        iVar4 = 0;
        lVar9 = local_290;
      }
    }
    uVar1 = prVar7[-1].runstyp;
    prVar6->runcxsp = prVar7 + -1;
    if (uVar1 == '\x05') {
      prVar6 = ctx->bifcxrun;
      prVar7 = prVar6->runcxsp;
      default_index = 0;
    }
    else {
      prVar6 = ctx->bifcxrun;
      if (prVar7[-1].runstyp != '\x01') goto LAB_00210299;
      prVar7 = prVar6->runcxsp;
      default_index = *(int *)&prVar7->runsv;
    }
    cancel_index = 0;
    uVar1 = prVar7[-1].runstyp;
    prVar6->runcxsp = prVar7 + -1;
    if (uVar1 != '\x05') {
      prVar6 = ctx->bifcxrun;
      if (prVar7[-1].runstyp != '\x01') goto LAB_00210299;
      cancel_index = *(int *)&prVar6->runcxsp->runsv;
    }
    outflushn(0);
    iVar4 = tio_input_dialog((int)lVar9,(char *)local_138,iVar4,local_288,(int)uVar11,default_index,
                             cancel_index);
    runpnum(ctx->bifcxrun,(long)iVar4);
    return;
  }
LAB_00210299:
  prVar6->runcxerr->errcxptr->erraac = 0;
  runsign(ctx->bifcxrun,0x3eb);
}

Assistant:

void bifinpdlg(bifcxdef *ctx, int argc)
{
    uchar *p;
    char prompt[256];
    char lblbuf[256];
    char *labels[10];
    char *dst;
    char *xp;
    uint len;
    size_t bcnt;
    int default_resp, cancel_resp;
    int resp;
    int std_btns;
    int icon_id;

    /* check for proper arguments */
    bifcntargs(ctx, 5, argc);

    /* get the icon number */
    icon_id = runpopnum(ctx->bifcxrun);

    /* get the prompt string */
    p = runpopstr(ctx->bifcxrun);
    bifcstr(ctx, prompt, (size_t)sizeof(prompt), p);

    /* translate from internal to local characters */
    for (xp = prompt ; *xp != '\0' ; xp++)
        *xp = (char)cmap_i2n(*xp);

    /* check for a standard button set selection */
    if (runtostyp(ctx->bifcxrun) == DAT_NUMBER)
    {
        /* get the standard button set ID */
        std_btns = runpopnum(ctx->bifcxrun);

        /* there are no actual buttons */
        bcnt = 0;
    }
    else
    {
        /* we're not using standard buttons */
        std_btns = 0;
        
        /* get the response string list */
        p = runpoplst(ctx->bifcxrun);
        len = osrp2(p);
        p += 2;
        
        /* build our internal button list */
        for (bcnt = 0, dst = lblbuf ; len != 0 ; lstadv(&p, &len))
        {
            /* see what we have */
            if (*p == DAT_SSTRING)
            {
                /* it's a label string - convert to a C string */
                bifcstr(ctx, dst, sizeof(lblbuf) - (dst - lblbuf), p + 1);

                /* translate from internal to local characters */
                for (xp = dst ; *xp != '\0' ; xp++)
                    *xp = (char)cmap_i2n(*xp);
                
                /* set this button to point to the converted text */
                labels[bcnt++] = dst;
                
                /* move past this label in the button buffer */
                dst += strlen(dst) + 1;
            }
            else if (*p == DAT_NUMBER)
            {
                int id;
                int resid;
                
                /* it's a standard system label ID - get the ID */
                id = (int)osrp4s(p + 1);

                /* translate it to the appropriate string resource */
                switch(id)
                {
                case BIFINPDLG_LBL_OK:
                    resid = RESID_BTN_OK;
                    break;
                    
                case BIFINPDLG_LBL_CANCEL:
                    resid = RESID_BTN_CANCEL;
                    break;
                    
                case BIFINPDLG_LBL_YES:
                    resid = RESID_BTN_YES;
                    break;
                    
                case BIFINPDLG_LBL_NO:
                    resid = RESID_BTN_NO;
                    break;

                default:
                    resid = 0;
                    break;
                }

                /* 
                 *   if we got a valid resource ID, load the resource;
                 *   otherwise, skip this button
                 */
                if (resid != 0
                    && !os_get_str_rsc(resid, dst,
                                       sizeof(lblbuf) - (dst - lblbuf)))
                {
                    /* set this button to point to the converted text */
                    labels[bcnt++] = dst;

                    /* move past this label in the button buffer */
                    dst += strlen(dst) + 1;
                }
            }
            
            /* if we have exhausted our label array, stop now */
            if (bcnt >= sizeof(labels)/sizeof(labels[0])
                || dst >= lblbuf + sizeof(lblbuf))
                break;
        }
    }

    /* get the default response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        default_resp = 0;
    }
    else
        default_resp = runpopnum(ctx->bifcxrun);

    /* get the cancel response */
    if (runtostyp(ctx->bifcxrun) == DAT_NIL)
    {
        rundisc(ctx->bifcxrun);
        cancel_resp = 0;
    }
    else
        cancel_resp = runpopnum(ctx->bifcxrun);

    /* flush output before showing the dialog */
    tioflushn(ctx->bifcxtio, 0);

    /* show the dialog */
    resp = tio_input_dialog(icon_id, prompt, std_btns,
                            (const char **)labels, bcnt,
                            default_resp, cancel_resp);

    /* return the result */
    runpnum(ctx->bifcxrun, resp);
}